

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void perfetto::base::StringCopy(char *dst,char *src,size_t dst_size)

{
  char cVar1;
  ulong local_28;
  size_t i;
  size_t dst_size_local;
  char *src_local;
  char *dst_local;
  
  local_28 = 0;
  while( true ) {
    if (dst_size <= local_28) {
      if (dst_size != 0) {
        dst[dst_size - 1] = '\0';
      }
      return;
    }
    cVar1 = src[local_28];
    dst[local_28] = cVar1;
    if (cVar1 == '\0') break;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

inline void StringCopy(char* dst, const char* src, size_t dst_size) {
  for (size_t i = 0; i < dst_size; ++i) {
    if ((dst[i] = src[i]) == '\0') {
      return;  // We hit and copied the null terminator.
    }
  }

  // We were left off at dst_size. We over copied 1 byte. Null terminate.
  if (PERFETTO_LIKELY(dst_size > 0))
    dst[dst_size - 1] = 0;
}